

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_2dPoint __thiscall
ON_PeriodicDomain::LiftToCover(ON_PeriodicDomain *this,ON_2dPoint Pin,bool stealth)

{
  int iVar1;
  ON_2dPoint OVar2;
  bool bVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  int local_74;
  int local_70;
  int i_2;
  int i_1;
  int deck [2];
  int i;
  int deck_in [2];
  ON_2dPoint nnext;
  ON_2dPoint out;
  bool stealth_local;
  ON_PeriodicDomain *this_local;
  ON_2dPoint Pin_local;
  
  Pin_local.y = Pin.x;
  nnext.y = Pin_local.y;
  memset(deck + 1,0,8);
  for (deck[0] = 0; deck[0] < 2; deck[0] = deck[0] + 1) {
    lVar5 = (long)deck[0];
    pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)&nnext.y,deck[0]);
    dVar6 = ON_Interval::NormalizedParameterAt(this->m_dom + lVar5,*pdVar4);
    pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,deck[0]);
    *pdVar4 = dVar6;
    if ((this->m_closed[deck[0]] & 1U) != 0) {
      pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,deck[0]);
      dVar6 = floor(*pdVar4);
      deck[(long)deck[0] + 1] = (int)dVar6;
      iVar1 = deck[(long)deck[0] + 1];
      pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,deck[0]);
      *pdVar4 = *pdVar4 - (double)iVar1;
    }
  }
  bVar3 = ON_2dPoint::operator==(&this->m_nprev,&ON_2dPoint::UnsetPoint);
  if (bVar3) {
    if (!stealth) {
      (this->m_nprev).x = (double)deck_in;
      (this->m_nprev).y = nnext.x;
      this->m_deck[0] = deck[1];
      this->m_deck[1] = i;
    }
  }
  else {
    i_2 = this->m_deck[0];
    i_1 = this->m_deck[1];
    for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
      if ((this->m_closed[local_70] & 1U) != 0) {
        pdVar4 = ON_2dPoint::operator[](&this->m_nprev,local_70);
        if ((this->m_normband <= *pdVar4) ||
           (pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,local_70),
           *pdVar4 <= 1.0 - this->m_normband)) {
          pdVar4 = ON_2dPoint::operator[](&this->m_nprev,local_70);
          if ((1.0 - this->m_normband < *pdVar4) &&
             (pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,local_70),
             *pdVar4 < this->m_normband)) {
            (&i_2)[local_70] = (&i_2)[local_70] + 1;
          }
        }
        else {
          (&i_2)[local_70] = (&i_2)[local_70] + -1;
        }
      }
    }
    for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
      iVar1 = (&i_2)[local_74];
      pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)deck_in,local_74);
      dVar6 = ON_Interval::ParameterAt(this->m_dom + local_74,(double)iVar1 + *pdVar4);
      pdVar4 = ON_2dPoint::operator[]((ON_2dPoint *)&nnext.y,local_74);
      *pdVar4 = dVar6;
    }
    if (!stealth) {
      this->m_deck[0] = i_2;
      this->m_deck[1] = i_1;
      (this->m_nprev).x = (double)deck_in;
      (this->m_nprev).y = nnext.x;
    }
    Pin_local.y = nnext.y;
  }
  OVar2.y = Pin.y;
  OVar2.x = Pin_local.y;
  return OVar2;
}

Assistant:

ON_2dPoint ON_PeriodicDomain::LiftToCover(ON_2dPoint Pin, bool stealth )
{
	ON_2dPoint out = Pin;
	ON_2dPoint nnext;
	int deck_in[2] = { 0,0 };
	//  decompose Pin
	//     Pin = m_dom.ParameterAt( deck + nnext)
	// where nnext[i] is in [0.0, 1.0)
	for (int i = 0; i < 2; i++)
	{
		nnext[i] = m_dom[i].NormalizedParameterAt(out[i]);
		if (m_closed[i])
		{
			deck_in[i] = int(floor(nnext[i]));
			nnext[i] -= deck_in[i];
		}
	}


	if (m_nprev == ON_2dPoint::UnsetPoint)
	{
		if( !stealth)
		{ 
			m_nprev = nnext;
			m_deck[0] = deck_in[0];
			m_deck[1] = deck_in[1];
		}
		return Pin;
	}

	int deck[2] = { m_deck[0], m_deck[1] };
	for (int i = 0; i < 2; i++)
	{
		if (!m_closed[i])
			continue;
		if (m_nprev[i]<m_normband &&  nnext[i]>1.0 - m_normband)
			deck[i] --;
		else if (m_nprev[i] > 1.0 - m_normband && nnext[i] < m_normband)
			deck[i]++;
	}

	for (int i = 0; i < 2; i++)
		out[i] = m_dom[i].ParameterAt(deck[i] + nnext[i]);
	
	if (!stealth)
	{
		m_deck[0] = deck[0]; 
		m_deck[1] = deck[1];
		m_nprev = nnext;
	}

	return out;
}